

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  loc_conflict *plVar1;
  undefined2 uVar2;
  loc lVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  bool bVar7;
  _Bool _Var8;
  ushort uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  wchar_t wVar13;
  loc_conflict grid;
  monster *pmVar14;
  loc lVar15;
  square *psVar16;
  monster_conflict *mon;
  uint uVar17;
  int iVar18;
  wchar_t wVar19;
  ulong uVar20;
  ulong uVar21;
  loc p;
  uint uVar22;
  _Bool local_71;
  int local_70;
  long local_58;
  
  grid = loc(context->x,context->y);
  uVar4._0_2_ = z_info->dungeon_hgt;
  uVar4._2_2_ = z_info->dungeon_wid;
  if ((ushort)(undefined2)uVar4 < z_info->dungeon_wid) {
    uVar4 = (uint)z_info->dungeon_wid;
  }
  local_71 = true;
  if ((context->origin).what == SRC_MONSTER) {
    local_71 = context->subtype != 0;
  }
  wVar19 = (context->value).base;
  wVar13 = (context->value).m_bonus;
  pmVar14 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  uVar20 = (ulong)grid >> 0x20;
  _Var8 = loc_is_zero(grid);
  if (_Var8) {
    if (pmVar14 == (monster *)0x0) {
      if (local_71 != false) {
        lVar15 = cave_find_decoy(cave);
        _Var8 = loc_is_zero((loc_conflict)lVar15);
        if ((_Var8) || (context->subtype == 0)) {
          plVar1 = &player->grid;
          grid.y = 0;
          grid.x = plVar1->x;
          lVar15.x = plVar1->x;
          lVar15.y = plVar1->y;
          uVar20 = (ulong)(uint)(player->grid).y;
          _Var8 = square_isno_teleport(cave,lVar15);
          if ((!_Var8) || (wVar19 < L'\v' && wVar19 != L'\0')) {
            _Var8 = player_of_has(player,L'\x19');
            bVar7 = true;
            if (!_Var8) goto LAB_0014006b;
            equip_learn_flag(player,L'\x19');
          }
          bVar7 = false;
          msg("Teleportation forbidden!");
        }
        else {
          square_destroy_decoy(cave,lVar15);
          bVar7 = false;
        }
LAB_0014006b:
        uVar22 = grid.x;
        if (!bVar7) {
          return true;
        }
        goto LAB_0013fc7b;
      }
      if ((context->origin).what != SRC_MONSTER) {
        __assert_fail("context->origin.what == SRC_MONSTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                      ,0xa00,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
      }
      pmVar14 = cave_monster(cave,(context->origin).which.monster);
    }
    grid.y = 0;
    grid.x = (pmVar14->grid).x;
    uVar20 = (ulong)(uint)(pmVar14->grid).y;
  }
  uVar22 = grid.x;
LAB_0013fc7b:
  if (wVar13 != L'\0') {
    uVar10 = (uint)uVar20;
    uVar17 = cave->height - uVar10;
    if ((int)uVar17 < (int)uVar10) {
      uVar17 = uVar10;
    }
    uVar10 = cave->width - uVar22;
    if ((int)uVar10 < (int)uVar22) {
      uVar10 = uVar22;
    }
    if ((int)uVar10 < (int)uVar17) {
      uVar10 = uVar17;
    }
    wVar19 = (uVar10 * wVar13) / 100;
  }
  uVar11 = Rand_div(2);
  wVar13 = wVar19 + L'\x03';
  if (L'\xffffffff' < wVar19) {
    wVar13 = wVar19;
  }
  uVar12 = Rand_div(wVar13 >> 2);
  uVar5 = -uVar12;
  if (uVar11 != 0) {
    uVar5 = uVar12;
  }
  if (cave->height < 3) {
    uVar11 = 0;
    p.x = L'\0';
    p.y = L'\0';
  }
  else {
    local_70 = (uVar4 & 0xffff) * 2;
    bVar7 = true;
    p.x = L'\0';
    p.y = L'\0';
    local_58 = 1;
    uVar11 = 0;
    do {
      if (2 < cave->width) {
        uVar21 = 1;
        do {
          lVar15 = (loc)(local_58 << 0x20 | uVar21);
          wVar13 = distance((loc_conflict)lVar15,(loc_conflict)((uVar20 << 0x20) + (ulong)uVar22));
          iVar18 = wVar13 - (wVar19 + uVar5);
          iVar6 = -iVar18;
          if (0 < iVar18) {
            iVar6 = iVar18;
          }
          if ((wVar13 != L'\0') &&
             (_Var8 = has_teleport_destination_prereqs((chunk *)cave,lVar15,local_71), _Var8)) {
            _Var8 = square_isvault(cave,lVar15);
            if (_Var8) {
              if (!bVar7) goto LAB_0013fe01;
            }
            else {
              if (bVar7) {
                uVar2 = z_info->dungeon_hgt;
                uVar9 = uVar2;
                if ((ushort)uVar2 < z_info->dungeon_wid) {
                  uVar9 = z_info->dungeon_wid;
                }
                local_70 = (uint)uVar9 * 2;
              }
              bVar7 = false;
            }
            if (iVar6 <= local_70) {
              lVar15 = (loc)mem_zalloc(0x10);
              *(int *)lVar15 = (int)uVar21;
              *(int *)((long)lVar15 + 4) = (int)local_58;
              if (iVar6 < local_70) {
                while (p != (loc)0x0) {
                  lVar3 = *(loc *)((long)p + 8);
                  mem_free((void *)p);
                  p = lVar3;
                }
                uVar11 = 1;
                p = lVar15;
                local_70 = iVar6;
              }
              else {
                *(loc *)((long)lVar15 + 8) = p;
                uVar11 = uVar11 + 1;
                p = lVar15;
              }
            }
          }
LAB_0013fe01:
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)cave->width + -1);
      }
      local_58 = local_58 + 1;
    } while (local_58 < (long)cave->height + -1);
  }
  if (uVar11 == 0) {
    if (local_71 == false) {
      mon = (monster_conflict *)cave_monster(cave,(context->origin).which.monster);
      _Var8 = square_isseen(cave,mon->grid);
      if (_Var8) {
        add_monster_message(mon,L'0',true);
      }
    }
    else {
      msg("Failed to find teleport destination!");
    }
  }
  else {
    uVar11 = Rand_div(uVar11);
    for (; uVar11 != 0; uVar11 = uVar11 - 1) {
      lVar15 = *(loc *)((long)p + 8);
      mem_free((void *)p);
      p = lVar15;
    }
    sound((uint)(local_71 ^ 1U) + (uint)(local_71 ^ 1U) * 4 + 10);
    monster_swap((loc)((ulong)uVar22 | uVar20 << 0x20),*(loc *)p);
    if (local_71 != false) {
      player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
    }
    psVar16 = square(cave,*(loc *)p);
    flag_off(psVar16->info,3,0x12);
    pmVar14 = target_get_monster();
    _Var8 = target_able(pmVar14);
    if (!_Var8) {
      target_set_monster((monster *)0x0);
    }
    handle_stuff(player);
    do {
      lVar15 = *(loc *)((long)p + 8);
      mem_free((void *)p);
      p = lVar15;
    } while (lVar15 != (loc)0x0);
  }
  return true;
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool is_player = (context->origin.what != SRC_MONSTER || context->subtype);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && context->subtype) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}